

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O3

Integer ga_idot_patch_(Integer *g_a,char *t_a,Integer *ailo,Integer *aihi,Integer *ajlo,
                      Integer *ajhi,Integer *g_b,char *t_b,Integer *bilo,Integer *bihi,Integer *bjlo
                      ,Integer *bjhi,int alen,int blen)

{
  Integer btype;
  Integer atype;
  Integer retval;
  Integer local_78;
  Integer local_70;
  Integer blo [2];
  Integer ahi [2];
  Integer alo [2];
  
  pnga_inquire_type(*g_a,&atype);
  pnga_inquire_type(*g_b,&btype);
  if (((atype != btype) || (0xf < atype - 0x3e9U)) ||
     ((0x8003UL >> (atype - 0x3e9U & 0x3f) & 1) == 0)) {
    pnga_error(" wrong types ",0);
  }
  alo[0] = *ailo;
  ahi[0] = *aihi;
  alo[1] = *ajlo;
  ahi[1] = *ajhi;
  blo[0] = *bilo;
  local_78 = *bihi;
  blo[1] = *bjlo;
  local_70 = *bjhi;
  pnga_dot_patch(*g_a,t_a,alo,ahi,*g_b,t_b,blo,&local_78,&retval);
  return retval;
}

Assistant:

Integer ga_idot_patch_(Integer *g_a, char *t_a, int alen, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, Integer *g_b, char *t_b, int blen, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi)
#endif
{
    Integer retval;
    Integer atype, btype;

    pnga_inquire_type(*g_a, &atype);
    pnga_inquire_type(*g_b, &btype);
    if (atype != btype
            || (atype != C_INT && atype != C_LONG && atype != C_LONGLONG))
        pnga_error(" wrong types ", 0L);
    sga_dot_patch(*g_a, t_a, ailo, aihi, ajlo, ajhi, *g_b, t_b, bilo, bihi, bjlo, bjhi, &retval);

    return retval;
}